

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void collect_init_els(c2m_ctx_t c2m_ctx,decl_t member_decl,type **type_ptr,
                     node_t_conflict initializer,int const_only_p,int top_p)

{
  node_code_t nVar1;
  type_mode tVar2;
  undefined4 uVar3;
  gen_ctx_conflict *pgVar4;
  byte *pbVar5;
  VARR_init_object_t *pVVar6;
  VARR_init_el_t *pVVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [48];
  bool bVar12;
  int iVar13;
  node_t_conflict pnVar14;
  mir_llong mVar15;
  init_object_t *piVar16;
  type *el_type;
  ulong uVar17;
  init_el_t *piVar18;
  mir_size_t mVar19;
  mir_llong mVar20;
  ulong uVar21;
  c2m_ctx_t pcVar22;
  c2m_ctx_t arr_type;
  size_t sVar23;
  node_t pnVar24;
  size_t sVar25;
  type *ptVar26;
  c2m_ctx_t type;
  node_t n;
  bool bVar27;
  int addr_p;
  symbol_t el;
  undefined1 local_c4 [20];
  pos_t local_b0;
  pos_t local_a0;
  undefined4 local_90;
  undefined4 uStack_8c;
  char *pcStack_88;
  long lStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  symbol_t local_60;
  
  pgVar4 = c2m_ctx->gen_ctx;
  arr_type = (c2m_ctx_t)*type_ptr;
  el_type = (type *)local_c4;
  local_c4._0_4_ = 0;
  pnVar14 = get_compound_literal(initializer,(int *)el_type);
  uVar3 = local_c4._0_4_;
  if (((local_c4._0_4_ == 0 && pnVar14 != (node_t_conflict)0x0) && (2 < initializer->code - N_STR))
     && (initializer = (pnVar14->u).ops.head, initializer != (node_t)0x0)) {
    initializer = (initializer->op_link).next;
  }
  bVar27 = top_p == 0;
  do {
    bVar12 = bVar27;
    nVar1 = initializer->code;
    if (nVar1 != N_LIST) {
      if ((nVar1 == N_STR) && (*(type_mode *)((long)arr_type->env[0].__jmpbuf + 8) == TM_ARR)) {
        el_type = ((anon_union_8_5_3fbb1736_for_u *)((long)arr_type->env[0].__jmpbuf + 0x20))->
                  ptr_type->arr_type;
        iVar13 = init_compatible_string_p(initializer,el_type);
        if (iVar13 != 0) goto LAB_001a9514;
      }
      if (((1 < nVar1 - N_STR) && (const_only_p != 0)) && (nVar1 != N_STR32)) {
        if (((*initializer->attr & 3) == 0) && (pnVar14 == (node_t_conflict)0x0 || uVar3 == 0)) {
          __assert_fail("initializer->code == N_STR || initializer->code == N_STR16 || initializer->code == N_STR32 || !const_only_p || cexpr->const_p || cexpr->const_addr_p || (literal != NULL && addr_p)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2ccf,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
      }
      if (pgVar4->init_els == (VARR_init_el_t *)0x0) goto LAB_001a9ea0;
      sVar25 = pgVar4->init_els->els_num;
      pcVar22 = c2m_ctx;
      el_type = (type *)get_object_path_offset(c2m_ctx);
      pVVar6 = c2m_ctx->init_object_path;
      if (pVVar6 == (VARR_init_object_t *)0x0) goto LAB_001a9ea5;
      if (pVVar6->els_num == 0) {
        ptVar26 = (type *)0x0;
      }
      else {
        if (pVVar6->varr == (init_object_t *)0x0) goto LAB_001a9eaf;
        ptVar26 = pVVar6->varr[pVVar6->els_num - 1].container_type;
      }
      pVVar7 = pgVar4->init_els;
      pcVar22 = (c2m_ctx_t)pVVar7->varr;
      if (pcVar22 != (c2m_ctx_t)0x0) {
        uVar17 = pVVar7->els_num + 1;
        if (pVVar7->size < uVar17) {
          sVar23 = (uVar17 >> 1) + uVar17;
          piVar18 = (init_el_t *)realloc(pcVar22,sVar23 * 0x38);
          pVVar7->varr = piVar18;
          pVVar7->size = sVar23;
        }
        sVar23 = pVVar7->els_num;
        piVar18 = pVVar7->varr;
        pVVar7->els_num = sVar23 + 1;
        piVar18[sVar23].c2m_ctx = c2m_ctx;
        piVar18[sVar23].num = sVar25;
        piVar18[sVar23].offset = (mir_size_t)el_type;
        piVar18[sVar23].member_decl = member_decl;
        goto LAB_001a9775;
      }
      goto LAB_001a9eaa;
    }
LAB_001a9514:
    n = (initializer->u).ops.head;
    pcVar22 = arr_type;
    if (nVar1 - N_STR < 3) {
LAB_001a9522:
      if (*(type_mode *)((long)arr_type->env[0].__jmpbuf + 8) == TM_ARR) {
        el_type = ((anon_union_8_5_3fbb1736_for_u *)((long)arr_type->env[0].__jmpbuf + 0x20))->
                  ptr_type->arr_type;
        iVar13 = init_compatible_string_p(initializer,el_type);
        if (iVar13 != 0) {
          if (pgVar4->init_els == (VARR_init_el_t *)0x0) goto LAB_001a9ebe;
          mVar19 = pgVar4->init_els->els_num;
          pcVar22 = c2m_ctx;
          el_type = (type *)get_object_path_offset(c2m_ctx);
          pVVar6 = c2m_ctx->init_object_path;
          if (pVVar6 == (VARR_init_object_t *)0x0) goto LAB_001a9ec3;
          if (pVVar6->els_num == 0) {
            ptVar26 = (type *)0x0;
          }
          else {
            if (pVVar6->varr == (init_object_t *)0x0) goto LAB_001a9ecd;
            ptVar26 = pVVar6->varr[pVVar6->els_num - 1].container_type;
          }
          pVVar7 = pgVar4->init_els;
          pcVar22 = (c2m_ctx_t)pVVar7->varr;
          if (pcVar22 != (c2m_ctx_t)0x0) {
            uVar17 = pVVar7->els_num + 1;
            if (pVVar7->size < uVar17) {
              sVar25 = (uVar17 >> 1) + uVar17;
              piVar18 = (init_el_t *)realloc(pcVar22,sVar25 * 0x38);
              pVVar7->varr = piVar18;
              pVVar7->size = sVar25;
            }
            sVar23 = pVVar7->els_num;
            piVar18 = pVVar7->varr;
            pVVar7->els_num = sVar23 + 1;
            piVar18[sVar23].c2m_ctx = c2m_ctx;
            piVar18[sVar23].num = mVar19;
            piVar18[sVar23].offset = (mir_size_t)el_type;
            piVar18[sVar23].member_decl = (decl_t)0x0;
LAB_001a9775:
            piVar18[sVar23].el_type = (type *)arr_type;
            piVar18[sVar23].container_type = ptVar26;
            piVar18[sVar23].init = initializer;
            return;
          }
          goto LAB_001a9ec8;
        }
      }
    }
    else {
      if (n == (node_t)0x0) {
        return;
      }
      if (((((n->code == N_INIT) && ((n->op_link).next == (node_t)0x0)) &&
           (pnVar24 = (n->u).ops.head, pnVar24->code == N_LIST)) &&
          (((pnVar24->u).s.s == (char *)0x0 && ((pnVar24->op_link).next != (node_t)0x0)))) &&
         (initializer = (pnVar24->op_link).next, initializer->code - N_STR < 3)) goto LAB_001a9522;
    }
    if (n == (node_t)0x0) {
      return;
    }
    if (n->code != N_INIT) {
      __assert_fail("init->code == N_INIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf2,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    pnVar24 = (n->u).ops.head;
    if (pnVar24->code != N_LIST) goto LAB_001a9de1;
    tVar2 = *(type_mode *)((long)arr_type->env[0].__jmpbuf + 8);
    if (tVar2 - TM_STRUCT < 3) {
      if (c2m_ctx->init_object_path == (VARR_init_object_t *)0x0) goto LAB_001a9eb4;
      sVar25 = c2m_ctx->init_object_path->els_num;
      if (tVar2 == TM_ARR) {
        mVar15 = get_arr_type_size((type *)arr_type);
        mVar20 = -1;
        if (mVar15 < 0) {
          __assert_fail("size_val >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2d02,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
      }
      else {
        mVar20 = 0;
      }
      pVVar6 = c2m_ctx->init_object_path;
      pcVar22 = (c2m_ctx_t)pVVar6->varr;
      if (pcVar22 == (c2m_ctx_t)0x0) goto LAB_001a9eb9;
      uVar17 = pVVar6->els_num + 1;
      if (pVVar6->size < uVar17) {
        sVar23 = (uVar17 >> 1) + uVar17;
        piVar16 = (init_object_t *)realloc(pcVar22,sVar23 * 0x18);
        pVVar6->varr = piVar16;
        pVVar6->size = sVar23;
      }
      sVar23 = pVVar6->els_num;
      piVar16 = pVVar6->varr;
      pVVar6->els_num = sVar23 + 1;
      piVar16[sVar23].container_type = (type *)arr_type;
      piVar16[sVar23].field_designator_p = 0;
      piVar16[sVar23].u.curr_index = mVar20;
      do {
        if (n->code != N_INIT) {
          __assert_fail("init->code == N_INIT",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2d09,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        pnVar24 = (n->u).ops.head;
        pnVar14 = (pnVar24->op_link).next;
        if (((pnVar14->code == N_LIST) || (pnVar14->code == N_COMPOUND_LITERAL)) &&
           (2 < *(type_mode *)((long)arr_type->env[0].__jmpbuf + 8) - TM_STRUCT)) {
          __assert_fail("(value->code != N_LIST && value->code != N_COMPOUND_LITERAL) || type->mode == TM_ARR || type->mode == TM_STRUCT || type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2d0d,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        pnVar24 = (pnVar24->u).ops.head;
        if (pnVar24 == (node_t)0x0) {
          local_a0 = get_node_pos(c2m_ctx,n);
          el_type = (type *)&DAT_00000001;
          pcVar22 = c2m_ctx;
          iVar13 = update_path_and_do(c2m_ctx,1,collect_init_els,sVar25,pnVar14,const_only_p,
                                      (mir_llong *)0x0,local_a0,"");
          if (iVar13 == 0) {
            __assert_fail("ok_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2d11,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
        }
        else {
          pVVar6 = c2m_ctx->init_object_path;
          if (((pVVar6 == (VARR_init_object_t *)0x0) || (pVVar6->varr == (init_object_t *)0x0)) ||
             (pVVar6->els_num < sVar25 + 1)) {
            collect_init_els_cold_7();
LAB_001a9de1:
            __assert_fail("des_list->code == N_LIST",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2cf4,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
          pVVar6->els_num = sVar25 + 1;
          bVar27 = false;
          type = arr_type;
          do {
            pVVar6 = c2m_ctx->init_object_path;
            if (((pVVar6 == (VARR_init_object_t *)0x0) ||
                (piVar16 = pVVar6->varr, piVar16 == (init_object_t *)0x0)) ||
               (sVar23 = pVVar6->els_num, sVar23 == 0)) {
              collect_init_els_cold_6();
              goto LAB_001a9cfe;
            }
            uVar3 = *(undefined4 *)&piVar16[sVar23 - 1].field_0xc;
            if (bVar27) {
              tVar2 = (piVar16[sVar23 - 1].container_type)->mode;
              if (tVar2 - TM_STRUCT < 2) {
                type = *(c2m_ctx_t *)((long)(piVar16[sVar23 - 1].u.curr_member)->attr + 0x40);
              }
              else {
                if (tVar2 != TM_ARR) goto LAB_001a9d9e;
                type = (c2m_ctx_t)(((piVar16[sVar23 - 1].container_type)->u).ptr_type)->arr_type;
              }
            }
            else {
              pVVar6->els_num = sVar23 - 1;
            }
            if (pnVar24->code == N_FIELD_ID) {
              if ((type->env[0].__jmpbuf[1] & 0xfffffffe) != 4) {
                __assert_fail("curr_type->mode == TM_STRUCT || curr_type->mode == TM_UNION",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d2a,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              pcStack_88 = (pnVar24->u).s.s;
              lStack_80 = type->env[0].__jmpbuf[4];
              local_90 = 0;
              auVar11._4_8_ = pcStack_88;
              auVar11._0_4_ = uStack_8c;
              auVar11._12_8_ = lStack_80;
              auVar11._20_8_ = uStack_78;
              auVar11._28_8_ = uStack_70;
              auVar11._36_8_ = uStack_68;
              auVar11._44_4_ = 0;
              iVar13 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,(symbol_t)(auVar11 << 0x20),HTAB_FIND,
                                        &local_60);
              if (iVar13 == 0) {
                __assert_fail("found_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d2c,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              process_init_field_designator(c2m_ctx,local_60.def_node,(type *)type);
              uVar10 = (uint)((pnVar24->op_link).next == (node_t)0x0);
              local_b0 = get_node_pos(c2m_ctx,n);
              el_type = (type *)(ulong)uVar10;
              pcVar22 = c2m_ctx;
              iVar13 = update_path_and_do(c2m_ctx,uVar10,collect_init_els,sVar25,pnVar14,
                                          const_only_p,(mir_llong *)0x0,local_b0,"");
              if (iVar13 == 0) {
                __assert_fail("ok_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d30,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
            }
            else {
              if (((int)type->env[0].__jmpbuf[1] != 6) ||
                 (pbVar5 = (byte *)pnVar24->attr, (*pbVar5 & 1) == 0)) {
LAB_001a9cfe:
                __assert_fail("curr_type->mode == TM_ARR && cexpr->const_p && integer_type_p (cexpr->type) && !incomplete_type_p (c2m_ctx, curr_type) && (arr_size_val = get_arr_type_size (curr_type)) >= 0 && (mir_ullong) arr_size_val > cexpr->c.u_val"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d37,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              iVar13 = *(int *)(*(long *)(pbVar5 + 0x18) + 0x18);
              if (iVar13 == 1) {
                bVar27 = *(int *)(*(long *)(pbVar5 + 0x18) + 0x30) - 2U < 0xc;
              }
              else {
                bVar27 = false;
              }
              if ((((iVar13 != 2) && (!bVar27)) ||
                  (iVar13 = incomplete_type_p(c2m_ctx,(type *)type), iVar13 != 0)) ||
                 ((uVar17 = get_arr_type_size((type *)type), (long)uVar17 < 0 ||
                  (uVar21 = *(ulong *)(pbVar5 + 0x30), uVar17 <= uVar21)))) goto LAB_001a9cfe;
              pVVar6 = c2m_ctx->init_object_path;
              if (pVVar6->varr == (init_object_t *)0x0) {
                collect_init_els_cold_5();
LAB_001a9d9e:
                __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d21,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              uVar17 = pVVar6->els_num + 1;
              if (pVVar6->size < uVar17) {
                sVar23 = (uVar17 >> 1) + uVar17;
                piVar16 = (init_object_t *)realloc(pVVar6->varr,sVar23 * 0x18);
                pVVar6->varr = piVar16;
                pVVar6->size = sVar23;
              }
              sVar23 = pVVar6->els_num;
              piVar16 = pVVar6->varr;
              pVVar6->els_num = sVar23 + 1;
              piVar16[sVar23].container_type = (type *)type;
              piVar16[sVar23].field_designator_p = 0;
              *(undefined4 *)&piVar16[sVar23].field_0xc = uVar3;
              piVar16[sVar23].u.curr_member = (node_t_conflict)(uVar21 - 1);
              uVar10 = (uint)((pnVar24->op_link).next == (node_t)0x0);
              local_c4._4_16_ = (undefined1  [16])get_node_pos(c2m_ctx,n);
              el_type = (type *)(ulong)uVar10;
              pcVar22 = c2m_ctx;
              iVar13 = update_path_and_do(c2m_ctx,uVar10,collect_init_els,sVar25,pnVar14,
                                          const_only_p,(mir_llong *)0x0,(pos_t)local_c4._4_16_,"");
              if (iVar13 == 0) {
                __assert_fail("ok_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d3e,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
            }
            pnVar24 = (pnVar24->op_link).next;
            bVar27 = true;
          } while (pnVar24 != (node_t)0x0);
        }
        n = (n->op_link).next;
      } while (n != (node_t)0x0);
      pVVar6 = c2m_ctx->init_object_path;
      if (((pVVar6 != (VARR_init_object_t *)0x0) && (pVVar6->varr != (init_object_t *)0x0)) &&
         (sVar25 <= pVVar6->els_num)) {
        pVVar6->els_num = sVar25;
        return;
      }
      collect_init_els_cold_8();
      arr_type = pcVar22;
LAB_001a9ea0:
      collect_init_els_cold_14();
      pcVar22 = arr_type;
LAB_001a9ea5:
      collect_init_els_cold_13();
LAB_001a9eaa:
      collect_init_els_cold_12();
LAB_001a9eaf:
      collect_init_els_cold_11();
LAB_001a9eb4:
      collect_init_els_cold_10();
LAB_001a9eb9:
      collect_init_els_cold_9();
LAB_001a9ebe:
      collect_init_els_cold_4();
LAB_001a9ec3:
      collect_init_els_cold_3();
LAB_001a9ec8:
      collect_init_els_cold_2();
LAB_001a9ecd:
      collect_init_els_cold_1();
      if (pcVar22 != (c2m_ctx_t)0x0) {
        return;
      }
      VARR_init_el_taddr_cold_1();
      lVar8 = *(long *)((long)pcVar22->env[0].__jmpbuf + 8);
      if ((lVar8 == 0) || ((int)*(uint *)(lVar8 + 4) < 0)) {
        uVar17 = 0;
      }
      else {
        uVar17 = (ulong)(*(uint *)(lVar8 + 4) >> 3);
      }
      lVar9 = *(long *)&el_type->mode;
      if ((lVar9 == 0) || ((int)*(uint *)(lVar9 + 4) < 0)) {
        uVar21 = 0;
      }
      else {
        uVar21 = (ulong)(*(uint *)(lVar9 + 4) >> 3);
      }
      uVar17 = uVar17 + pcVar22->env[0].__jmpbuf[0];
      uVar21 = uVar21 + *(long *)&el_type->antialias;
      if ((((uVar21 <= uVar17) && (uVar17 <= uVar21)) &&
          ((lVar8 == 0 || lVar9 == 0 || (*(int *)(lVar9 + 4) <= *(int *)(lVar8 + 4))))) &&
         ((lVar8 == 0 || lVar9 == 0 || (*(int *)(lVar8 + 4) <= *(int *)(lVar9 + 4))))) {
        if (lVar8 != 0) {
          ptVar26 = *(type **)(lVar8 + 0x40);
          mVar19 = raw_type_size((c2m_ctx_t)pcVar22->ctx,ptVar26);
          uVar17 = (ulong)ptVar26->align;
          if (uVar17 != 0) {
            uVar21 = (mVar19 - 1) + uVar17;
            mVar19 = uVar21 - uVar21 % uVar17;
          }
          if (mVar19 == 0) {
            return;
          }
        }
        if (*(long *)&el_type->mode != 0) {
          raw_type_size((c2m_ctx_t)el_type->pos_node,*(type **)(*(long *)&el_type->mode + 0x40));
        }
      }
      return;
    }
    if (((n->op_link).next != (node_t)0x0) || ((pnVar24->u).s.s != (char *)0x0)) {
      __assert_fail("NL_NEXT (init) == NULL && NL_HEAD (des_list->u.ops) == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf6,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    initializer = (pnVar24->op_link).next;
    bVar27 = true;
    if (bVar12) {
      __assert_fail("top_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf8,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
  } while( true );
}

Assistant:

static void collect_init_els (c2m_ctx_t c2m_ctx, decl_t member_decl, struct type **type_ptr,
                              node_t initializer, int const_only_p, int top_p MIR_UNUSED) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  struct type *type = *type_ptr;
  struct expr *cexpr;
  node_t literal, des_list, curr_des, str, init, value;
  mir_llong MIR_UNUSED size_val = 0; /* to remove an uninitialized warning */
  size_t mark;
  symbol_t sym;
  init_el_t init_el;
  int addr_p = FALSE; /* to remove an uninitialized warning */
  int MIR_UNUSED found_p, MIR_UNUSED ok_p;
  init_object_t init_object;

  literal = get_compound_literal (initializer, &addr_p);
  if (literal != NULL && !addr_p && initializer->code != N_STR && initializer->code != N_STR16
      && initializer->code != N_STR32)
    initializer = NL_EL (literal->u.ops, 1);
check_one_value:
  if (initializer->code != N_LIST
      && !(initializer->code == N_STR && type->mode == TM_ARR
           && init_compatible_string_p (initializer, type->u.arr_type->el_type))) {
    cexpr = initializer->attr;
    /* static or thread local object initialization should be const expr or addr: */
    assert (initializer->code == N_STR || initializer->code == N_STR16
            || initializer->code == N_STR32 || !const_only_p || cexpr->const_p
            || cexpr->const_addr_p || (literal != NULL && addr_p));
    init_el.c2m_ctx = c2m_ctx;
    init_el.num = VARR_LENGTH (init_el_t, init_els);
    init_el.offset = get_object_path_offset (c2m_ctx);
    init_el.member_decl = member_decl;
    init_el.el_type = type;
    init_el.container_type = VARR_LENGTH (init_object_t, init_object_path) == 0
                               ? NULL
                               : VARR_LAST (init_object_t, init_object_path).container_type;
    init_el.init = initializer;
    VARR_PUSH (init_el_t, init_els, init_el);
    return;
  }
  init = NL_HEAD (initializer->u.ops);
  if (((str = initializer)->code == N_STR || str->code == N_STR16
       || str->code == N_STR32 /* string or string in parentheses  */
       || (init != NULL && init->code == N_INIT && NL_EL (initializer->u.ops, 1) == NULL
           && (des_list = NL_HEAD (init->u.ops))->code == N_LIST
           && NL_HEAD (des_list->u.ops) == NULL && NL_EL (init->u.ops, 1) != NULL
           && ((str = NL_EL (init->u.ops, 1))->code == N_STR || str->code == N_STR16
               || str->code == N_STR32)))
      && type->mode == TM_ARR && init_compatible_string_p (str, type->u.arr_type->el_type)) {
    init_el.c2m_ctx = c2m_ctx;
    init_el.num = VARR_LENGTH (init_el_t, init_els);
    init_el.offset = get_object_path_offset (c2m_ctx);
    init_el.member_decl = NULL;
    init_el.el_type = type;
    init_el.container_type = VARR_LENGTH (init_object_t, init_object_path) == 0
                               ? NULL
                               : VARR_LAST (init_object_t, init_object_path).container_type;
    init_el.init = str;
    VARR_PUSH (init_el_t, init_els, init_el);
    return;
  }
  if (init == NULL) return;
  assert (init->code == N_INIT);
  des_list = NL_HEAD (init->u.ops);
  assert (des_list->code == N_LIST);
  if (type->mode != TM_ARR && type->mode != TM_STRUCT && type->mode != TM_UNION) {
    assert (NL_NEXT (init) == NULL && NL_HEAD (des_list->u.ops) == NULL);
    initializer = NL_NEXT (des_list);
    assert (top_p);
    top_p = FALSE;
    goto check_one_value;
  }
  mark = VARR_LENGTH (init_object_t, init_object_path);
  init_object.container_type = type;
  init_object.field_designator_p = FALSE;
  if (type->mode == TM_ARR) {
    size_val = get_arr_type_size (type);
    /* we already figured out the array size during check: */
    assert (size_val >= 0);
    init_object.u.curr_index = -1;
  } else {
    init_object.u.curr_member = NULL;
  }
  VARR_PUSH (init_object_t, init_object_path, init_object);
  for (; init != NULL; init = NL_NEXT (init)) {
    assert (init->code == N_INIT);
    des_list = NL_HEAD (init->u.ops);
    value = NL_NEXT (des_list);
    assert ((value->code != N_LIST && value->code != N_COMPOUND_LITERAL) || type->mode == TM_ARR
            || type->mode == TM_STRUCT || type->mode == TM_UNION);
    if ((curr_des = NL_HEAD (des_list->u.ops)) == NULL) {
      ok_p = update_path_and_do (c2m_ctx, TRUE, collect_init_els, mark, value, const_only_p, NULL,
                                 POS (init), "");
      assert (ok_p);
    } else {
      struct type *curr_type = type;
      mir_llong arr_size_val MIR_UNUSED;
      int first_p = TRUE;

      VARR_TRUNC (init_object_t, init_object_path, mark + 1);
      for (; curr_des != NULL; curr_des = NL_NEXT (curr_des), first_p = FALSE) {
        init_object = VARR_LAST (init_object_t, init_object_path);
        if (first_p) {
          VARR_POP (init_object_t, init_object_path);
        } else {
          if (init_object.container_type->mode == TM_ARR) {
            curr_type = init_object.container_type->u.arr_type->el_type;
          } else {
            assert (init_object.container_type->mode == TM_STRUCT
                    || init_object.container_type->mode == TM_UNION);
            decl_t el_decl = init_object.u.curr_member->attr;
            curr_type = el_decl->decl_spec.type;
          }
        }
        if (curr_des->code == N_FIELD_ID) {
          node_t id = NL_HEAD (curr_des->u.ops);

          /* field should be only in struct/union initializer */
          assert (curr_type->mode == TM_STRUCT || curr_type->mode == TM_UNION);
          found_p = symbol_find (c2m_ctx, S_REGULAR, id, curr_type->u.tag_type, &sym);
          assert (found_p); /* field should present */
          process_init_field_designator (c2m_ctx, sym.def_node, curr_type);
          ok_p = update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, collect_init_els, mark,
                                     value, const_only_p, NULL, POS (init), "");
          assert (ok_p);
        } else {
          cexpr = curr_des->attr;
          /* index should be in array initializer and const expr of right type and value: */
          assert (curr_type->mode == TM_ARR && cexpr->const_p && integer_type_p (cexpr->type)
                  && !incomplete_type_p (c2m_ctx, curr_type)
                  && (arr_size_val = get_arr_type_size (curr_type)) >= 0
                  && (mir_ullong) arr_size_val > cexpr->c.u_val);
          init_object.u.curr_index = cexpr->c.i_val - 1;
          init_object.field_designator_p = FALSE;
          init_object.container_type = curr_type;
          VARR_PUSH (init_object_t, init_object_path, init_object);
          ok_p = update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, collect_init_els, mark,
                                     value, const_only_p, NULL, POS (init), "");
          assert (ok_p);
        }
      }
    }
  }
  VARR_TRUNC (init_object_t, init_object_path, mark);
}